

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.h
# Opt level: O0

int32_t icu_63::umtx_loadAcquire(u_atomic_int32_t *var)

{
  u_atomic_int32_t *var_local;
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return (var->super___atomic_base<int>)._M_i;
}

Assistant:

inline int32_t umtx_loadAcquire(u_atomic_int32_t &var) {
    return var.load(std::memory_order_acquire);
}